

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O0

void __thiscall MetaSim::DebugStream::enter(DebugStream *this,string *s,string *header)

{
  bool bVar1;
  ostream *this_00;
  DebugStream *in_RDX;
  string *in_RSI;
  DebugStream *in_RDI;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  DebugStream *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_38,in_RSI);
  enter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  bVar1 = filter(in_RDI);
  if (bVar1) {
    indent(in_RDX);
    this_00 = std::operator<<(in_RDI->_os,(string *)in_RDX);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    resetIndent(in_RDI);
    in_RDI->_indentLevel = in_RDI->_indentLevel + 1;
  }
  return;
}

Assistant:

void DebugStream::enter(std::string s, std::string header) 
    {
        enter(s);
        if (filter()) {
            indent();
            (*_os) << header << endl;
            resetIndent();
            _indentLevel++;
        }
    }